

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry_entries.cpp
# Opt level: O2

void __thiscall
ot::commissioner::persistent_storage::Network::Network
          (Network *this,NetworkId *aId,DomainId *aDomainId,string *aName,uint64_t aXpan,
          uint aChannel,uint16_t aPan,string *aMlp,int aCcm)

{
  (this->mId).mId = aId->mId;
  (this->mDomainId).mId = aDomainId->mId;
  std::__cxx11::string::string((string *)&this->mName,(string *)aName);
  this->mXpan = aXpan;
  this->mChannel = aChannel;
  this->mPan = aPan;
  std::__cxx11::string::string((string *)&this->mMlp,(string *)aMlp);
  this->mCcm = aCcm;
  return;
}

Assistant:

Network::Network(const NetworkId   &aId,
                 const DomainId    &aDomainId,
                 const std::string &aName,
                 uint64_t           aXpan,
                 unsigned int       aChannel,
                 uint16_t           aPan,
                 const std::string &aMlp,
                 int                aCcm)
    : mId(aId)
    , mDomainId(aDomainId)
    , mName(aName)
    , mXpan(aXpan)
    , mChannel(aChannel)
    , mPan(aPan)
    , mMlp(aMlp)
    , mCcm(aCcm)
{
}